

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void writeRuleText(FILE *out,rule *rp)

{
  symbol *psVar1;
  long lVar2;
  long lVar3;
  
  fprintf((FILE *)out,"%s ::=",rp->lhs->name);
  if (0 < rp->nrhs) {
    lVar2 = 0;
    do {
      psVar1 = rp->rhs[lVar2];
      if (psVar1->type == MULTITERMINAL) {
        fprintf((FILE *)out," %s",(*psVar1->subsym)->name);
        if (1 < psVar1->nsubsym) {
          lVar3 = 1;
          do {
            fprintf((FILE *)out,"|%s",psVar1->subsym[lVar3]->name);
            lVar3 = lVar3 + 1;
          } while (lVar3 < psVar1->nsubsym);
        }
      }
      else {
        fprintf((FILE *)out," %s",psVar1->name);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < rp->nrhs);
  }
  return;
}

Assistant:

static void writeRuleText(FILE *out, struct rule *rp){
  int j;
  fprintf(out,"%s ::=", rp->lhs->name);
  for(j=0; j<rp->nrhs; j++){
    struct symbol *sp = rp->rhs[j];
    if( sp->type!=MULTITERMINAL ){
      fprintf(out," %s", sp->name);
    }else{
      int k;
      fprintf(out," %s", sp->subsym[0]->name);
      for(k=1; k<sp->nsubsym; k++){
        fprintf(out,"|%s",sp->subsym[k]->name);
      }
    }
  }
}